

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDirect.cpp
# Opt level: O2

bool ParseTestDirectLine(string *sString)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  LLPoint LVar6;
  string_type sStack_378;
  undefined1 local_358 [16];
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_348;
  string sRxPat;
  string sComputedDestLong;
  string sComputedDestLat;
  string sTestId;
  string sAzimuth;
  string sDist;
  string sStartLong;
  string sStartLat;
  string sDestLat;
  string local_128;
  string local_108;
  regex pat;
  string sDestLong;
  int sub_matches [7];
  
  local_358._8_8_ = local_358._0_8_;
  trim(sString," \t\n\r\f\v");
  sTestId._M_dataplus._M_p = (pointer)&sTestId.field_2;
  sTestId._M_string_length = 0;
  sStartLat._M_dataplus._M_p = (pointer)&sStartLat.field_2;
  sStartLat._M_string_length = 0;
  sTestId.field_2._M_local_buf[0] = '\0';
  sStartLat.field_2._M_local_buf[0] = '\0';
  sStartLong._M_dataplus._M_p = (pointer)&sStartLong.field_2;
  sStartLong._M_string_length = 0;
  sDist._M_dataplus._M_p = (pointer)&sDist.field_2;
  sDist._M_string_length = 0;
  sStartLong.field_2._M_local_buf[0] = '\0';
  sDist.field_2._M_local_buf[0] = '\0';
  sAzimuth._M_dataplus._M_p = (pointer)&sAzimuth.field_2;
  sAzimuth._M_string_length = 0;
  sComputedDestLat._M_dataplus._M_p = (pointer)&sComputedDestLat.field_2;
  sComputedDestLat._M_string_length = 0;
  sAzimuth.field_2._M_local_buf[0] = '\0';
  sComputedDestLat.field_2._M_local_buf[0] = '\0';
  sComputedDestLong._M_dataplus._M_p = (pointer)&sComputedDestLong.field_2;
  sComputedDestLong._M_string_length = 0;
  sComputedDestLong.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sRxPat,"([a-zA-Z]*\\d*)[,]",(allocator *)&sDestLat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&pat,&sRxPat,0x11);
  sub_matches[4] = 5;
  sub_matches[5] = 6;
  sub_matches[6] = 7;
  sub_matches[0] = 1;
  sub_matches[1] = 2;
  sub_matches[2] = 3;
  sub_matches[3] = 4;
  __a._M_current = (sString->_M_dataplus)._M_p;
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<7ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)&sDestLat,__a,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__a._M_current + sString->_M_string_length),&pat,&sub_matches,0);
  sDestLong.field_2._M_allocated_capacity = 0;
  sDestLong.field_2._8_8_ = 0;
  sDestLong._M_dataplus._M_p = (pointer)0x0;
  sDestLong._M_string_length = 0;
  bVar2 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)&sDestLat,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)&sDestLong);
  if (bVar2) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_348,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sDestLat,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sStack_378,local_348._M_result);
    std::__cxx11::string::operator=((string *)&sTestId,(string *)&sStack_378);
    std::__cxx11::string::~string((string *)&sStack_378);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_348);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_348,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sDestLat,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sStack_378,local_348._M_result);
    std::__cxx11::string::operator=((string *)&sStartLat,(string *)&sStack_378);
    std::__cxx11::string::~string((string *)&sStack_378);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_348);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_348,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sDestLat,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sStack_378,local_348._M_result);
    std::__cxx11::string::operator=((string *)&sStartLong,(string *)&sStack_378);
    std::__cxx11::string::~string((string *)&sStack_378);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_348);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_348,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sDestLat,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sStack_378,local_348._M_result);
    std::__cxx11::string::operator=((string *)&sDist,(string *)&sStack_378);
    std::__cxx11::string::~string((string *)&sStack_378);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_348);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_348,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sDestLat,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sStack_378,local_348._M_result);
    std::__cxx11::string::operator=((string *)&sAzimuth,(string *)&sStack_378);
    std::__cxx11::string::~string((string *)&sStack_378);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_348);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_348,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sDestLat,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sStack_378,local_348._M_result);
    std::__cxx11::string::operator=((string *)&sComputedDestLat,(string *)&sStack_378);
    std::__cxx11::string::~string((string *)&sStack_378);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_348);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_348,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&sDestLat,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&sStack_378,local_348._M_result);
    std::__cxx11::string::operator=((string *)&sComputedDestLong,(string *)&sStack_378);
    std::__cxx11::string::~string((string *)&sStack_378);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_348);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)&sDestLong);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)&sDestLat);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pat);
  std::__cxx11::string::~string((string *)&sRxPat);
  std::__cxx11::string::string((string *)&local_108,(string *)&sStartLat);
  local_358._0_8_ = ParseLatitude(&local_108);
  std::__cxx11::string::string((string *)&local_128,(string *)&sStartLong);
  dVar1 = ParseLongitude(&local_128);
  sDestLat._M_dataplus._M_p = (pointer)((double)local_358._0_8_ * 0.017453292519943295);
  sDestLat._M_string_length = (size_type)(dVar1 * 0.017453292519943295);
  dVar1 = atof(sAzimuth._M_dataplus._M_p);
  local_358._0_8_ = dVar1 * 0.017453292519943295;
  dVar1 = atof(sDist._M_dataplus._M_p);
  LVar6 = GeoCalcs::DestVincenty((LLPoint *)&sDestLat,(double)local_358._0_8_,dVar1 * 1852.0);
  local_358._8_4_ = extraout_XMM0_Dc;
  local_358._0_8_ = LVar6.latitude;
  local_358._12_4_ = extraout_XMM0_Dd;
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  dVar1 = LVar6.longitude * 57.29577951308232;
  local_348._M_position._M_end._M_current._0_4_ = SUB84(dVar1,0);
  local_348._M_position._M_begin._M_current = (double)local_358._0_8_ * 57.29577951308232;
  local_348._M_position._M_end._M_current._4_4_ = (int)((ulong)dVar1 >> 0x20);
  ConvertLatitudeDdToDms_abi_cxx11_(&sDestLat,(double *)&local_348);
  ConvertLongitudeDdToDms_abi_cxx11_(&sDestLong,(double *)((long)&local_348 + 8));
  iVar3 = std::__cxx11::string::compare((string *)&sDestLat);
  if (iVar3 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\n");
    poVar5 = std::operator<<(poVar5,(string *)&sTestId);
    poVar5 = std::operator<<(poVar5,"failed: Expected latitude: ");
    poVar5 = std::operator<<(poVar5,(string *)&sComputedDestLat);
    poVar5 = std::operator<<(poVar5,"  calced: ");
    std::operator<<(poVar5,(string *)&sDestLat);
  }
  iVar4 = std::__cxx11::string::compare((string *)&sDestLong);
  if (iVar4 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\n");
    poVar5 = std::operator<<(poVar5,(string *)&sTestId);
    poVar5 = std::operator<<(poVar5,"failed: Expected longitude: ");
    poVar5 = std::operator<<(poVar5,(string *)&sComputedDestLong);
    poVar5 = std::operator<<(poVar5,"  calced: ");
    std::operator<<(poVar5,(string *)&sDestLong);
  }
  std::__cxx11::string::~string((string *)&sDestLong);
  std::__cxx11::string::~string((string *)&sDestLat);
  std::__cxx11::string::~string((string *)&sComputedDestLong);
  std::__cxx11::string::~string((string *)&sComputedDestLat);
  std::__cxx11::string::~string((string *)&sAzimuth);
  std::__cxx11::string::~string((string *)&sDist);
  std::__cxx11::string::~string((string *)&sStartLong);
  std::__cxx11::string::~string((string *)&sStartLat);
  std::__cxx11::string::~string((string *)&sTestId);
  return iVar4 == 0 && iVar3 == 0;
}

Assistant:

bool ParseTestDirectLine(string sString)
{
    bool bPassed = true;
    trim(sString);
    string sTestId, sStartLat, sStartLong, sDist, sAzimuth;
    string sComputedDestLat, sComputedDestLong;

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";
        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sStartLat = *it++;
            sStartLong = *it++;
            sDist = *it++;
            sAzimuth = *it++;
            sComputedDestLat = *it++;
            sComputedDestLong = *it++;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }


    LLPoint ll = DestVincenty(LLPoint(Deg2Rad(ParseLatitude(sStartLat)), Deg2Rad(ParseLongitude(sStartLong))),
                              Deg2Rad(atof(sAzimuth.c_str())), NmToMeters(atof(sDist.c_str())));
    ll.latitude = Rad2Deg(ll.latitude);
    ll.longitude = Rad2Deg(ll.longitude);
    string sDestLat = ConvertLatitudeDdToDms(ll.latitude); // + (ll.latitude < 0.0 ? + "S" : + "N");
    string sDestLong = ConvertLongitudeDdToDms(ll.longitude); // + (ll.longitude < 0.0 ? + "W" : + "E");
    //  double dComputedDestLat = ParseLatitude(sComputedDestLat);
    //  double dComputedDestLong = ParseLongitude(sComputedDestLong);

    if (sDestLat.compare(sComputedDestLat) != 0)
    {
        cout << "\n" << sTestId << "failed: Expected latitude: " << sComputedDestLat << "  calced: " << sDestLat;
        bPassed = false;
    }
    if (sDestLong.compare(sComputedDestLong) != 0)
    {
        cout << "\n" << sTestId << "failed: Expected longitude: " << sComputedDestLong << "  calced: " << sDestLong;
        bPassed = false;
    }
    return bPassed;
}